

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontStructMatrix.cpp
# Opt level: O1

void __thiscall
TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_>::AssembleNew
          (TPZFrontStructMatrix<TPZFrontSym<double>,_double,_TPZStructMatrixOR<double>_> *this,
          TPZMatrix<double> *stiffness,TPZFMatrix<double> *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  TPZCompMesh *mesh;
  long lVar1;
  TPZReference *pTVar2;
  TPZCompEl *pTVar3;
  bool bVar4;
  int iVar5;
  int64_t size;
  TPZCompEl **ppTVar6;
  long lVar7;
  TPZFMatrix<double> *rhs_00;
  long lVar8;
  long lVar9;
  TPZVec<int> elorder;
  TPZManVector<long,_10> sourceindex;
  TPZManVector<long,_10> destinationindex;
  TPZElementMatrixT<double> ek;
  TPZElementMatrixT<double> ef;
  int local_87f4;
  TPZMatrix<double> *local_87f0;
  TPZCompMesh *local_87e8;
  TPZFNMatrix<1000,_double> *local_87e0;
  TPZFMatrix<double> *local_87d8;
  TPZFNMatrix<1000,_double> *local_87d0;
  TPZFMatrix<double> *local_87c8;
  TPZEquationFilter *local_87c0;
  TPZFMatrix<double> *local_87b8;
  TPZVec<int> local_87b0;
  TPZManVector<long,_10> local_8790;
  TPZManVector<long,_10> local_8720;
  TPZElementMatrixT<double> local_86b0;
  TPZElementMatrixT<double> local_4370;
  
  mesh = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
  lVar1 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  local_87f0 = stiffness;
  local_87b8 = rhs;
  TPZElementMatrixT<double>::TPZElementMatrixT(&local_86b0,mesh,EK);
  TPZElementMatrixT<double>::TPZElementMatrixT
            (&local_4370,(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh,EF);
  TPZManVector<long,_10>::TPZManVector(&local_8720,0);
  TPZManVector<long,_10>::TPZManVector(&local_8790,0);
  local_87e8 = (this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fMesh;
  size = TPZCompMesh::NEquations(local_87e8);
  local_87f4 = 0;
  TPZVec<int>::TPZVec(&local_87b0,size,&local_87f4);
  OrderElement(this);
  if (0 < lVar1) {
    local_87e8 = (TPZCompMesh *)&local_87e8->fElementVec;
    local_87c0 = &(this->super_TPZStructMatrixT<double>).super_TPZStructMatrix.fEquationFilter;
    local_87d0 = &local_86b0.fConstrMat;
    local_87c8 = &local_4370.fConstrMat.super_TPZFMatrix<double>;
    local_87e0 = &local_86b0.fMat;
    local_87d8 = &local_4370.fMat.super_TPZFMatrix<double>;
    lVar8 = 0;
    lVar9 = 0;
    do {
      pTVar2 = guiInterface->fRef;
      if ((pTVar2 != (TPZReference *)0x0) && (pTVar2->fPointer != (TPZGuiInterface *)0x0)) {
        bVar4 = TPZGuiInterface::AmIKilled(pTVar2->fPointer);
        if (bVar4) break;
      }
      lVar7 = (long)*(int *)(*(long *)&this->field_0xb0 + lVar8 * 4);
      if (-1 < lVar7) {
        ppTVar6 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                            ((TPZChunkVector<TPZCompEl_*,_10> *)local_87e8,lVar7);
        pTVar3 = *ppTVar6;
        if (pTVar3 != (TPZCompEl *)0x0) {
          (**(code **)(*(long *)pTVar3 + 0x108))(pTVar3,&local_86b0,&local_4370);
          TPZElementMatrix::ComputeDestinationIndices(&local_86b0.super_TPZElementMatrix);
          TPZEquationFilter::Filter
                    (local_87c0,&local_86b0.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                     &local_86b0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          if (this->f_quiet == 0) {
            if ((lVar9 * -0x3333333333333333 + 0x1999999999999998U >> 2 |
                lVar9 * -0x3333333333333333 << 0x3e) < 0xccccccccccccccd) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
              std::ostream::put(-0x58);
              lVar7 = std::ostream::flush();
              std::ostream::_M_insert<long>(lVar7);
            }
            local_87f4 = CONCAT31(local_87f4._1_3_,0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,(char *)&local_87f4,1);
            std::ostream::flush();
          }
          iVar5 = (**(code **)(*(long *)pTVar3 + 0x1f0))(pTVar3);
          if (iVar5 == 0) {
            (*(local_87f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                      (local_87f0,local_87e0,&local_86b0.super_TPZElementMatrix.fSourceIndex,
                       &local_86b0.super_TPZElementMatrix.fDestinationIndex);
            rhs_00 = local_87d8;
          }
          else {
            TPZElementMatrixT<double>::ApplyConstraints(&local_86b0);
            TPZElementMatrixT<double>::ApplyConstraints(&local_4370);
            (*(local_87f0->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x34])
                      (local_87f0,local_87d0,&local_86b0.super_TPZElementMatrix.fSourceIndex,
                       &local_86b0.super_TPZElementMatrix.fDestinationIndex);
            rhs_00 = local_87c8;
          }
          TPZFMatrix<double>::AddFel
                    (local_87b8,rhs_00,
                     &local_86b0.super_TPZElementMatrix.fSourceIndex.super_TPZVec<long>,
                     &local_86b0.super_TPZElementMatrix.fDestinationIndex.super_TPZVec<long>);
          lVar9 = lVar9 + 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar1 != lVar8);
  }
  if (this->f_quiet == 0) {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
  }
  local_87b0._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5b0;
  if (local_87b0.fStore != (int *)0x0) {
    operator_delete__(local_87b0.fStore);
  }
  TPZManVector<long,_10>::~TPZManVector(&local_8790);
  TPZManVector<long,_10>::~TPZManVector(&local_8720);
  local_4370.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_4370.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_4370.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_4370.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_4370.super_TPZElementMatrix);
  local_86b0.super_TPZElementMatrix._vptr_TPZElementMatrix =
       (_func_int **)&PTR__TPZElementMatrixT_0194d7b0;
  TPZBlock::~TPZBlock(&local_86b0.fConstrBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fConstrMat.super_TPZFMatrix<double>,&PTR_PTR_01884558)
  ;
  TPZBlock::~TPZBlock(&local_86b0.fBlock);
  TPZFMatrix<double>::~TPZFMatrix(&local_86b0.fMat.super_TPZFMatrix<double>,&PTR_PTR_01884558);
  TPZElementMatrix::~TPZElementMatrix(&local_86b0.super_TPZElementMatrix);
  return;
}

Assistant:

void TPZFrontStructMatrix<TFront,TVar,TPar>::AssembleNew(TPZMatrix<TVar> & stiffness, TPZFMatrix<TVar> & rhs,TPZAutoPointer<TPZGuiInterface> guiInterface){
	
	int64_t iel;
	int64_t numel = 0, nelem = this->fMesh->NElements();
	TPZElementMatrixT<TVar> ek(this->fMesh,TPZElementMatrix::EK),ef(this->fMesh,TPZElementMatrix::EF);
	TPZManVector<int64_t> destinationindex(0);
	TPZManVector<int64_t> sourceindex(0);
	
	TPZAdmChunkVector<TPZCompEl *> &elementvec = this->fMesh->ElementVec();
	
	
	/**Rearange elements order*/
	TPZVec<int> elorder(this->fMesh->NEquations(),0);
	
	OrderElement();
	
	
	for(iel=0; iel < nelem; iel++) {
		
		if(guiInterface) if(guiInterface->AmIKilled()){
			break;
		}
		
		if(fElementOrder[iel] < 0) continue;
		TPZCompEl *el = elementvec[fElementOrder[iel]];
		if(!el) continue;
		//		int dim = el->NumNodes();
		
		//Builds elements stiffness matrix
		el->CalcStiff(ek,ef);
		ek.ComputeDestinationIndices();
		this->FilterEquations(ek.fSourceIndex,ek.fDestinationIndex);
		//ek.fMat->Print(out);
		//ef.fMat->Print();
		if(!f_quiet)
		{
			if(!(numel%20)) cout << endl << numel;
			//    if(!(numel%20)) cout << endl;
			cout << '*';
			cout.flush();
		}
		numel++;
		
		if(!el->HasDependency()) {
			stiffness.AddKel(ek.fMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fMat,ek.fSourceIndex, ek.fDestinationIndex);
		}
		else {
			//ek.Print(*this->fMesh,cout);
			ek.ApplyConstraints();
			ef.ApplyConstraints();
			stiffness.AddKel(ek.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			rhs.AddFel(ef.fConstrMat,ek.fSourceIndex,ek.fDestinationIndex);
			/*
			 if(ek.fConstrMat->Decompose_LU() != -1) {
			 el->ApplyConstraints(ek,ef);
			 ek.Print(*this,check);
			 check.flush();
			 }
			 */
		}
		
	}//fim for iel
	if(!f_quiet)
	{
		cout << endl;
	}
}